

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O0

CMConnection Tunneling_get_conn(CManager cm,attr_list attrs)

{
  int iVar1;
  ssize_t sVar2;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int forward_port;
  char msg [256];
  int read_len;
  size_t remaining;
  char recv_buffer [2048];
  size_t bytes_recd;
  int nbytes_last;
  int nbytes_total;
  int sock;
  int tmp;
  int _addr;
  hostent *host_addr;
  char *server_hostname;
  int server_addr;
  anon_union_16_2_c960cb83 sock_addr;
  int request_len;
  char IPstr [16];
  char *DestinationHostStr;
  int DestinationPort;
  int DestinationIP;
  char *format_string;
  char request [1024];
  attr_list conn_attrs;
  char *group_id;
  uint local_dbc;
  undefined1 local_db8 [260];
  int local_cb4;
  long local_cb0;
  undefined1 local_ca8 [2056];
  long local_4a0;
  int local_494;
  int local_490;
  int local_48c;
  uint32_t local_488;
  in_addr_t local_484;
  hostent *local_480;
  char *local_478;
  uint32_t local_470;
  sockaddr local_46c;
  int local_45c;
  char local_458 [24];
  char *local_440;
  undefined4 local_438;
  int local_434;
  char *local_430;
  char local_428 [1024];
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  CMConnection local_8;
  
  local_20 = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = get_string_attr(in_RSI,SST_GROUP_ID_ATOM,&local_20);
  if (iVar1 == 0) {
    local_8 = (CMConnection)CMget_conn(local_10,local_18);
  }
  else {
    memset(local_428,0,0x400);
    local_430 = "/connect_port?group=%s&service=%s&dhost=%s&dport=%d";
    iVar1 = get_int_attr(local_18,IP_PORT_ATOM,&local_438);
    if (iVar1 == 0) {
      fprintf(_stderr,"No IP_PORT atom\n");
      local_8 = (CMConnection)0x0;
    }
    else {
      iVar1 = get_int_attr(local_18,IP_ADDR_ATOM,&local_434);
      if (iVar1 == 0) {
        local_434 = 0;
      }
      iVar1 = get_string_attr(local_18,IP_HOST_ATOM,&local_440);
      if (iVar1 == 0) {
        fprintf(_stderr,"No IP_HOST");
        local_440 = (char *)0x0;
      }
      if ((local_440 == (char *)0x0) && (local_434 == 0)) {
        fprintf(_stderr,"NO IP or Hostname for tunnel\n");
        local_8 = (CMConnection)0x0;
      }
      else {
        if (local_440 == (char *)0x0) {
          inet_ntop(2,&local_434,local_458,0x10);
          local_440 = local_458;
        }
        local_45c = snprintf(local_428,0x400,local_430,local_20,"service_5",local_440,local_438);
        local_470 = 0x7f000001;
        local_478 = getenv("TUNNEL_SERVER_HOST");
        if (local_478 != (char *)0x0) {
          local_480 = gethostbyname(local_478);
          if (local_480 == (hostent *)0x0) {
            local_484 = inet_addr(local_478);
            local_470 = local_484;
            if (local_484 == 0xffffffff) {
              return (CMConnection)0x0;
            }
          }
          else {
            memcpy(&local_488,*local_480->h_addr_list,(long)local_480->h_length);
            local_470 = ntohl(local_488);
          }
        }
        local_46c.sa_family = 2;
        local_46c.sa_data._2_4_ = htonl(local_470);
        local_46c.sa_data._0_2_ = htons(30000);
        local_48c = socket(2,1,0);
        iVar1 = connect(local_48c,&local_46c,0x10);
        if (iVar1 == -1) {
          printf("connect Error\n");
          local_8 = (CMConnection)0x0;
        }
        else {
          printf("Request is \"%s\"\n",local_428);
          for (local_490 = 0; local_490 < local_45c; local_490 = local_494 + local_490) {
            sVar2 = write(local_48c,local_428 + local_490,(long)(local_45c - local_490));
            local_494 = (int)sVar2;
            if (local_494 == -1) {
              printf("Error\n");
            }
          }
          local_4a0 = 0;
          while( true ) {
            local_cb0 = 0x800 - local_4a0;
            local_cb4 = (int)local_cb0;
            sVar2 = read(local_48c,local_ca8 + local_4a0,(long)local_cb4);
            local_490 = (int)sVar2;
            if (local_490 == 0) break;
            if (local_490 == -1) {
              printf("Error\n");
            }
            local_4a0 = local_490 + local_4a0;
          }
          close(local_48c);
          printf("We got %s from the tunnel server\n",local_ca8);
          __isoc99_sscanf(local_ca8,"port:%d,msg:%s",&local_dbc,local_db8);
          printf("Forward port is %d\n",(ulong)local_dbc);
          local_28 = create_attr_list();
          add_attr(local_28,IP_PORT_ATOM,1,(long)(int)local_dbc);
          add_attr(local_28,IP_ADDR_ATOM,1,(long)(int)local_470);
          local_8 = (CMConnection)CMget_conn(local_10,local_28);
        }
      }
    }
  }
  return local_8;
}

Assistant:

CMConnection Tunneling_get_conn(CManager cm, attr_list attrs)
{
    char *group_id = NULL;
    if (get_string_attr(attrs, SST_GROUP_ID_ATOM, &group_id))
    {
        attr_list conn_attrs;
        // do the tunneling
        char request[1024] = {'\0'};
        const char *format_string = "/connect_port?group=%s&service=%s&dhost=%s&dport=%d";
        int DestinationIP;
        int DestinationPort;
        char *DestinationHostStr;
        if (!get_int_attr(attrs, IP_PORT_ATOM, &DestinationPort))
        {
            fprintf(stderr, "No IP_PORT atom\n");
            return NULL;
        }
        if (!get_int_attr(attrs, IP_ADDR_ATOM, &DestinationIP))
        {
            DestinationIP = 0;
        }
        if (!get_string_attr(attrs, IP_HOST_ATOM, &DestinationHostStr))
        {
            fprintf(stderr, "No IP_HOST");
            DestinationHostStr = NULL;
        }
        char IPstr[INET_ADDRSTRLEN];
        if ((DestinationHostStr == NULL) && (DestinationIP == 0))
        {
            fprintf(stderr, "NO IP or Hostname for tunnel\n");
            return NULL;
        }
        else if (DestinationHostStr == NULL)
        {
            inet_ntop(AF_INET, &DestinationIP, IPstr, INET_ADDRSTRLEN);
            DestinationHostStr = &IPstr[0];
        }
        int request_len = snprintf(request, sizeof(request), format_string, group_id, "service_5",
                                   DestinationHostStr, DestinationPort);
        union
        {
            struct sockaddr s;
            struct sockaddr_in s_I4;
        } sock_addr;

        int server_addr = INADDR_LOOPBACK;
        char *server_hostname = getenv("TUNNEL_SERVER_HOST");
        if (server_hostname)
        {
            struct hostent *host_addr;
            host_addr = gethostbyname(server_hostname);
            if (host_addr == NULL)
            {
                int _addr;
                _addr = inet_addr(server_hostname);
                if (_addr == -1)
                {
                    /*
                     *  not translatable as a hostname or
                     * as a dot-style string IP address
                     */
                    return 0;
                }
                if (sizeof(int) == sizeof(struct in_addr))
                    server_addr = (int)_addr;
                else
                {
                    printf("Bad struct size\n");
                    return NULL;
                }
            }
            else
            {
                int tmp;
                memcpy(&tmp, host_addr->h_addr, host_addr->h_length);
                server_addr = ntohl(tmp);
            }
        }
        sock_addr.s_I4.sin_family = AF_INET;
        sock_addr.s_I4.sin_addr.s_addr = htonl(server_addr);
        sock_addr.s_I4.sin_port = htons(30000);

        int sock = socket(AF_INET, SOCK_STREAM, 0);
        /* Actually connect. */
        if (connect(sock, (struct sockaddr *)&sock_addr.s_I4, sizeof(sock_addr)) == -1)
        {
            printf("connect Error\n");
            return NULL;
        }

        /* Send request. */
        printf("Request is \"%s\"\n", request);
        int nbytes_total = 0;
        while (nbytes_total < request_len)
        {
            int nbytes_last = write(sock, request + nbytes_total, request_len - nbytes_total);
            if (nbytes_last == -1)
                printf("Error\n");
            nbytes_total += nbytes_last;
        }

        /* Read the response. */
        size_t bytes_recd = 0;
        char recv_buffer[2048];
        while (1)
        {
            size_t remaining = sizeof(recv_buffer) - bytes_recd;
            int read_len = remaining;
            nbytes_total = read(sock, recv_buffer + bytes_recd, read_len);
            if (nbytes_total == 0)
            {
                break;
            }
            if (nbytes_total == -1)
            {
                printf("Error\n");
            }
            bytes_recd += nbytes_total;
        }

        close(sock);
        printf("We got %s from the tunnel server\n", recv_buffer);
        char msg[256];
        int forward_port;
        sscanf(recv_buffer, "port:%d,msg:%s", &forward_port, &msg[0]);
        printf("Forward port is %d\n", forward_port);
        conn_attrs = create_attr_list();
        add_attr(conn_attrs, IP_PORT_ATOM, Attr_Int4, (attr_value)(intptr_t)forward_port);

        add_attr(conn_attrs, IP_ADDR_ATOM, Attr_Int4, (attr_value)server_addr);

        return CMget_conn(cm, conn_attrs);
    }
    else
    {
        return CMget_conn(cm, attrs);
    }
}